

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O1

bool __thiscall tcmalloc::PageHeap::CheckState(PageHeap *this)

{
  _Rb_tree_header *p_Var1;
  Span *pSVar2;
  void ***pppvVar3;
  void **ppvVar4;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  void *pvVar10;
  uint64_t uVar11;
  Span *pSVar12;
  Span *pSVar13;
  ulong uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar7 == 0) {
    if (-1 < this->release_rate_) {
      if (0x80 < this->release_index_) {
        __assert_fail("release_index_ <= 128",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x5d,"bool tcmalloc::PageHeap::CheckState()");
      }
      if ((this->stat).returned_bytes + (this->stat).normal_bytes + (this->stat).in_used_bytes !=
          (this->stat).system_bytes) {
        __assert_fail("(stat.normal_bytes + stat.returned_bytes + stat.in_used_bytes) == stat.system_bytes"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x5e,"bool tcmalloc::PageHeap::CheckState()");
      }
      bVar6 = CheckSmallList(this);
      if (!bVar6) {
        __assert_fail("CheckSmallList()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x5f,"bool tcmalloc::PageHeap::CheckState()");
      }
      lVar9 = 0;
      uVar17 = 0;
      uVar15 = 0;
      do {
        pSVar2 = this->small_normal_ + lVar9;
        pSVar12 = pSVar2->next;
        if (pSVar12 != pSVar2) {
          iVar7 = (int)this->small_normal_size_[lVar9] + 1;
          do {
            iVar7 = iVar7 + -1;
            if (iVar7 < 1) {
              __assert_fail("count >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x6a,"bool tcmalloc::PageHeap::CheckState()");
            }
            if (pSVar12->location != 1) {
              __assert_fail("span->location == Span::IN_NORMAL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x6b,"bool tcmalloc::PageHeap::CheckState()");
            }
            uVar14 = pSVar12->page_id;
            pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
            if ((pppvVar3 == (void ***)0x0) ||
               (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
              pSVar13 = (Span *)0x0;
            }
            else {
              pSVar13 = (Span *)ppvVar4[(uint)uVar14 & 0xfffff];
            }
            if (pSVar13 != pSVar12) {
              __assert_fail("page_map_.Get(span->page_id) == span",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x6c,"bool tcmalloc::PageHeap::CheckState()");
            }
            uVar14 = (uVar14 + pSVar12->npages) - 1;
            pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
            if ((pppvVar3 == (void ***)0x0) ||
               (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
              pSVar13 = (Span *)0x0;
            }
            else {
              pSVar13 = (Span *)ppvVar4[(uint)uVar14 & 0xfffff];
            }
            if (pSVar13 != pSVar12) {
              __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x6d,"bool tcmalloc::PageHeap::CheckState()");
            }
            uVar15 = uVar15 + pSVar12->npages * 0x2000;
            pSVar12 = pSVar12->next;
          } while (pSVar12 != pSVar2);
        }
        pSVar2 = this->small_returned_ + lVar9;
        pSVar12 = pSVar2->next;
        if (pSVar12 != pSVar2) {
          iVar7 = (int)this->small_returned_size_[lVar9] + 1;
          do {
            iVar7 = iVar7 + -1;
            if (iVar7 < 1) {
              __assert_fail("count >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x73,"bool tcmalloc::PageHeap::CheckState()");
            }
            if (pSVar12->location != 2) {
              __assert_fail("span->location == Span::IN_RETURNED",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x74,"bool tcmalloc::PageHeap::CheckState()");
            }
            uVar14 = pSVar12->page_id;
            pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
            if ((pppvVar3 == (void ***)0x0) ||
               (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
              pSVar13 = (Span *)0x0;
            }
            else {
              pSVar13 = (Span *)ppvVar4[(uint)uVar14 & 0xfffff];
            }
            if (pSVar13 != pSVar12) {
              __assert_fail("page_map_.Get(span->page_id) == span",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x75,"bool tcmalloc::PageHeap::CheckState()");
            }
            uVar14 = (uVar14 + pSVar12->npages) - 1;
            pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
            if ((pppvVar3 == (void ***)0x0) ||
               (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
              pSVar13 = (Span *)0x0;
            }
            else {
              pSVar13 = (Span *)ppvVar4[(uint)uVar14 & 0xfffff];
            }
            if (pSVar13 != pSVar12) {
              __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                            ,0x76,"bool tcmalloc::PageHeap::CheckState()");
            }
            uVar17 = uVar17 + pSVar12->npages * 0x2000;
            pSVar12 = pSVar12->next;
          } while (pSVar12 != pSVar2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      p_Var8 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 == p_Var1) {
        uVar16 = 0;
      }
      else {
        iVar7 = (int)(this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        uVar16 = 0;
        do {
          iVar7 = iVar7 + -1;
          if (iVar7 < 1) {
            __assert_fail("count >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x7e,"bool tcmalloc::PageHeap::CheckState()");
          }
          pvVar5 = *(void **)(p_Var8 + 1);
          if (*(long *)((long)pvVar5 + 0x40) != 1) {
            __assert_fail("(*it)->location == Span::IN_NORMAL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x7f,"bool tcmalloc::PageHeap::CheckState()");
          }
          uVar14 = *(ulong *)((long)pvVar5 + 0x10);
          pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
          if ((pppvVar3 == (void ***)0x0) ||
             (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
            pvVar10 = (void *)0x0;
          }
          else {
            pvVar10 = ppvVar4[(uint)uVar14 & 0xfffff];
          }
          if (pvVar10 != pvVar5) {
            __assert_fail("page_map_.Get((*it)->page_id) == (*it)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x80,"bool tcmalloc::PageHeap::CheckState()");
          }
          uVar14 = (uVar14 + *(long *)((long)pvVar5 + 0x18)) - 1;
          pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
          if ((pppvVar3 == (void ***)0x0) ||
             (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
            pvVar10 = (void *)0x0;
          }
          else {
            pvVar10 = ppvVar4[(uint)uVar14 & 0xfffff];
          }
          if (pvVar10 != pvVar5) {
            __assert_fail("page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x81,"bool tcmalloc::PageHeap::CheckState()");
          }
          lVar9 = *(long *)((long)pvVar5 + 0x18) * 0x2000;
          uVar15 = uVar15 + lVar9;
          uVar16 = uVar16 + lVar9;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
      p_Var8 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 == p_Var1) {
        uVar11 = 0;
      }
      else {
        iVar7 = (int)(this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        uVar11 = 0;
        do {
          iVar7 = iVar7 + -1;
          if (iVar7 < 1) {
            __assert_fail("count >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x88,"bool tcmalloc::PageHeap::CheckState()");
          }
          pvVar5 = *(void **)(p_Var8 + 1);
          if (*(long *)((long)pvVar5 + 0x40) != 2) {
            __assert_fail("(*it)->location == Span::IN_RETURNED",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x89,"bool tcmalloc::PageHeap::CheckState()");
          }
          uVar14 = *(ulong *)((long)pvVar5 + 0x10);
          pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
          if ((pppvVar3 == (void ***)0x0) ||
             (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
            pvVar10 = (void *)0x0;
          }
          else {
            pvVar10 = ppvVar4[(uint)uVar14 & 0xfffff];
          }
          if (pvVar10 != pvVar5) {
            __assert_fail("page_map_.Get((*it)->page_id) == (*it)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x8a,"bool tcmalloc::PageHeap::CheckState()");
          }
          uVar14 = (uVar14 + *(long *)((long)pvVar5 + 0x18)) - 1;
          pppvVar3 = (this->page_map_).roots[uVar14 >> 0x2a];
          if ((pppvVar3 == (void ***)0x0) ||
             (ppvVar4 = pppvVar3[(uint)(uVar14 >> 0x14) & 0x3fffff], ppvVar4 == (void **)0x0)) {
            pvVar10 = (void *)0x0;
          }
          else {
            pvVar10 = ppvVar4[(uint)uVar14 & 0xfffff];
          }
          if (pvVar10 != pvVar5) {
            __assert_fail("page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x8b,"bool tcmalloc::PageHeap::CheckState()");
          }
          lVar9 = *(long *)((long)pvVar5 + 0x18) * 0x2000;
          uVar17 = uVar17 + lVar9;
          uVar11 = uVar11 + lVar9;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
      if (uVar16 != (this->stat).large_normal_bytes) {
        __assert_fail("large_normal_bytes == stat.large_normal_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x90,"bool tcmalloc::PageHeap::CheckState()");
      }
      if (uVar11 != (this->stat).large_returned_bytes) {
        __assert_fail("large_returned_bytes == stat.large_returned_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x91,"bool tcmalloc::PageHeap::CheckState()");
      }
      if (uVar15 != (this->stat).normal_bytes) {
        __assert_fail("normal_bytes == stat.normal_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x92,"bool tcmalloc::PageHeap::CheckState()");
      }
      if (uVar17 != (this->stat).returned_bytes) {
        __assert_fail("returned_bytes == stat.returned_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x93,"bool tcmalloc::PageHeap::CheckState()");
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
      return true;
    }
  }
  else {
    std::__throw_system_error(iVar7);
  }
  __assert_fail("0 <= release_rate_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0x5c,"bool tcmalloc::PageHeap::CheckState()");
}

Assistant:

bool CheckState() {
        std::lock_guard<std::mutex> guard(lock);
        assert(0 <= release_rate_);
        assert(release_index_ <= 128);
        assert((stat.normal_bytes + stat.returned_bytes + stat.in_used_bytes) == stat.system_bytes);
        assert(CheckSmallList());

        uint64_t normal_bytes = 0;
        uint64_t returned_bytes = 0;
        uint64_t large_normal_bytes = 0;
        uint64_t large_returned_bytes = 0;

        for (int i = 0; i <= spanSmallPages; ++i) {
            int count = small_normal_size_[i];
            for (Span* span = small_normal_[i].next; span != &small_normal_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_NORMAL);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                normal_bytes += span->npages * spanPageSize;
            }
            count = small_returned_size_[i];
            for (Span* span = small_returned_[i].next; span != &small_returned_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_RETURNED);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                returned_bytes += span->npages * spanPageSize;
            }
        }

        int count = large_normal_.size();
        for (auto it = large_normal_.begin(); it != large_normal_.end(); ++it) {
            count--;
            assert(count >= 0);
            assert((*it)->location == Span::IN_NORMAL);
            assert(page_map_.Get((*it)->page_id) == (*it));
            assert(page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it));
            normal_bytes += (*it)->npages * spanPageSize;
            large_normal_bytes += (*it)->npages * spanPageSize;
        }
        count = large_returned_.size();
        for (auto it = large_returned_.begin(); it != large_returned_.end(); ++it) {
            count--;
            assert(count >= 0);
            assert((*it)->location == Span::IN_RETURNED);
            assert(page_map_.Get((*it)->page_id) == (*it));
            assert(page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it));
            returned_bytes += (*it)->npages * spanPageSize;
            large_returned_bytes += (*it)->npages * spanPageSize;
        }

        assert(large_normal_bytes == stat.large_normal_bytes);
        assert(large_returned_bytes == stat.large_returned_bytes);
        assert(normal_bytes == stat.normal_bytes);
        assert(returned_bytes == stat.returned_bytes);

        return true;
    }